

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

IDummyTransformationSceneNode * __thiscall
irr::scene::CSceneManager::addDummyTransformationSceneNode
          (CSceneManager *this,ISceneNode *parent,s32 id)

{
  CDummyTransformationSceneNode *this_00;
  
  if (parent == (ISceneNode *)0x0) {
    parent = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
  }
  this_00 = (CDummyTransformationSceneNode *)operator_new(0x150);
  CDummyTransformationSceneNode::CDummyTransformationSceneNode
            (this_00,parent,&this->super_ISceneManager,id);
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IDummyTransformationSceneNode *)this_00;
}

Assistant:

IDummyTransformationSceneNode *CSceneManager::addDummyTransformationSceneNode(
		ISceneNode *parent, s32 id)
{
	if (!parent)
		parent = this;

	IDummyTransformationSceneNode *node = new CDummyTransformationSceneNode(
			parent, this, id);
	node->drop();

	return node;
}